

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ArenaStringPtr::Destroy(ArenaStringPtr *this)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  pvVar1 = (this->tagged_ptr_).ptr_;
  puVar2 = (undefined8 *)((ulong)pvVar1 ^ 2);
  if (((ulong)puVar2 & 3) == 0) {
    if (pvVar1 == (void *)0x2) {
      protobuf_assumption_failed
                ("ptr != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/arenastring.h"
                 ,0x99);
    }
  }
  else {
    puVar2 = (undefined8 *)0x0;
  }
  if (puVar2 != (undefined8 *)0x0) {
    if ((long *)*puVar2 != puVar2 + 2) {
      operator_delete((long *)*puVar2,puVar2[2] + 1);
    }
    operator_delete(puVar2,0x20);
    return;
  }
  return;
}

Assistant:

std::string* ArenaStringPtr::Release() {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  if (IsDefault()) return nullptr;

  std::string* released = tagged_ptr_.Get();
  if (tagged_ptr_.IsArena()) {
    released = tagged_ptr_.IsMutable() ? new std::string(std::move(*released))
                                       : new std::string(*released);
  }
  InitDefault();
  return released;
}